

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkincludes.cpp
# Opt level: O1

HFSubConsumer * __thiscall
MlmWrap::createConsumerSub(MlmWrap *this,HighFreqDataType *dt,size_t messageBufferLength)

{
  SubType SVar1;
  HFSubConsumer *this_00;
  HighFreqDataType HStack_298;
  HFSubSockSettings local_208;
  HighFreqDataType local_160;
  SubType local_d0;
  undefined4 uStack_cc;
  hfs_data_callback_fn p_Stack_c8;
  void *pvStack_c0;
  HighFreqDataType local_b8;
  
  this_00 = (HFSubConsumer *)operator_new(0x3c8);
  HighFreqDataType::HighFreqDataType(&HStack_298,dt);
  HFSubConsumer::HFSubConsumer
            (this_00,&HStack_298,messageBufferLength,default_consumer_queue_filter);
  HighFreqDataType::~HighFreqDataType(&HStack_298);
  addSubToList(this,(HighFreqSub *)this_00);
  HighFreqDataType::HighFreqDataType(&local_b8,dt);
  SVar1 = (this_00->super_HighFreqSub).sockType;
  HighFreqDataType::HighFreqDataType(&local_160,&local_b8);
  p_Stack_c8 = (hfs_data_callback_fn)0x0;
  pvStack_c0 = (void *)0x0;
  local_d0 = SVar1;
  HighFreqDataType::~HighFreqDataType(&local_b8);
  HighFreqDataType::HighFreqDataType(&local_208.dataType,&local_160);
  local_208.args = pvStack_c0;
  local_208._148_4_ = uStack_cc;
  local_208.subSockType = local_d0;
  local_208.userFoo = p_Stack_c8;
  addHfTypeToSubbedList(this,&local_208);
  HighFreqDataType::~HighFreqDataType(&local_208.dataType);
  HighFreqDataType::~HighFreqDataType(&local_160);
  return this_00;
}

Assistant:

HFSubConsumer* MlmWrap::createConsumerSub(HighFreqDataType dt, size_t messageBufferLength){
//    std::cout << "creating subscriber \n";
    HFSubConsumer *newSub = new HFSubConsumer(dt, messageBufferLength);
    addSubToList(newSub);

    HFSubSockSettings sockInfo(dt, newSub->getSubSockType(), NULL, NULL);
    addHfTypeToSubbedList(sockInfo);
    //todo: add a check to see if newSub was created properly, if not, don't add the type to the subbedList

    return newSub;
}